

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O2

void __thiscall SourceMapTest_Fibonacci_Test::TestBody(SourceMapTest_Fibonacci_Test *this)

{
  string *sourceMap_00;
  char *in_R9;
  size_t l;
  size_t location;
  undefined1 local_98 [8];
  optional<wasm::Function::DebugLocation> loc;
  string sourceMap;
  AssertionResult gtest_ar_;
  Message local_30;
  AssertHelper local_28;
  
  sourceMap_00 = (string *)
                 ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                         _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                         _M_payload._M_value.symbolNameIndex.
                         super__Optional_base<unsigned_int,_true,_true> + 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sourceMap_00,
             "\n    {\n      \"version\":3,\n      \"sources\":[\"fib.c\"],\n      \"names\":[],\n      \"mappings\": \"moBAEA,4BAKA,QAJA,OADA,OAAA,uCAKA\"\n    }\n  "
             ,(allocator<char> *)&gtest_ar_.message_);
  SourceMapTest::parseMap(&this->super_SourceMapTest,sourceMap_00);
  ::wasm::SourceMapReader::readDebugLocationAt((ulong)local_98);
  sourceMap.field_2._M_local_buf[8] =
       loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ ^ 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ != '\0') {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)(sourceMap.field_2._M_local_buf + 8),
               (AssertionResult *)"loc.has_value()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0xb2,(char *)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_30.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_30.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x283,0,3,0,(optional<unsigned_int>)0x0);
  for (location = 0x284; location != 0x29f; location = location + 1) {
    SourceMapTest::ExpectDbgLocEq
              (&this->super_SourceMapTest,location,0,3,0,(optional<unsigned_int>)0x0);
  }
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x29f,0,8,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2a7,0,4,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2ae,0,3,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2b5,0,3,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2dc,0,8,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,0x2dd,0,8,0,(optional<unsigned_int>)0x0);
  SourceMapTest::ExpectDbgLocEq(&this->super_SourceMapTest,9999,0,8,0,(optional<unsigned_int>)0x0);
  std::__cxx11::string::~string
            ((string *)
             ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value
                     .symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4));
  return;
}

Assistant:

TEST_F(SourceMapTest, Fibonacci) {
  // Test mapping parsing and debug locs
  std::string sourceMap = R"(
    {
      "version":3,
      "sources":["fib.c"],
      "names":[],
      "mappings": "moBAEA,4BAKA,QAJA,OADA,OAAA,uCAKA"
    }
  )";
  parseMap(sourceMap);

  // Location before the first record has no value
  auto loc = reader->readDebugLocationAt(642);
  EXPECT_FALSE(loc.has_value());

  // TODO: These column numbers show as 0 but emsymbolizer.py prints them as 1.
  // Figure out which is right.
  // First location
  ExpectDbgLocEq(643, 0, 3, 0, std::nullopt);
  // locations in between records have the same value as the previous one.
  for (size_t l = 644; l < 671; l++) {
    ExpectDbgLocEq(l, 0, 3, 0, std::nullopt);
  }
  // Subsequent ones are on record boundaries
  ExpectDbgLocEq(671, 0, 8, 0, std::nullopt);
  ExpectDbgLocEq(679, 0, 4, 0, std::nullopt);
  ExpectDbgLocEq(686, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(693, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(732, 0, 8, 0, std::nullopt);
  // Entries after the last record have the same value as the last one.
  ExpectDbgLocEq(733, 0, 8, 0, std::nullopt);
  // Should we return empty values for locations that are past the end of the
  // program?
  ExpectDbgLocEq(9999, 0, 8, 0, std::nullopt);
}